

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ports.cpp
# Opt level: O0

bool port_is_enabled(Port *port,char *loc,size_t loc_size,Ports *base,void *runtime,
                    bool relative_to_parent,port_walker_t walker,void *data)

{
  long lVar1;
  undefined8 uVar2;
  int iVar3;
  char *pcVar4;
  Port *pPVar5;
  size_t sVar6;
  char *pcVar7;
  char *pcVar8;
  char *pcVar9;
  char acStackY_140 [8];
  size_t sStackY_138;
  long lStackY_130;
  char acStackY_128 [8];
  size_t sStackY_120;
  Port *in_stack_fffffffffffffee8;
  char acStack_110 [6];
  bool local_10a;
  bool local_109;
  char *local_108;
  char *local_100;
  char *local_f8;
  Ports *local_f0;
  char *local_e8;
  undefined6 in_stack_ffffffffffffff20;
  bool bVar10;
  undefined1 uVar11;
  undefined1 uVar12;
  Ports *in_stack_ffffffffffffff28;
  char *old_end;
  MetaContainer *pMStack_c8;
  bool res;
  char *last_slash;
  unsigned_long __vla_expr1;
  char *collapsed_loc;
  unsigned_long __vla_expr0;
  char local_98 [4];
  int loclen;
  rtosc_arg_val_t rval;
  Port *ask_port;
  Ports *ask_ports;
  char *ask_port_str;
  char *pcStack_60;
  bool subport;
  char *e;
  char *n;
  char *enable_port;
  bool relative_to_parent_local;
  void *runtime_local;
  Ports *base_local;
  size_t loc_size_local;
  char *loc_local;
  Port *port_local;
  
  if ((port == (Port *)0x0) || (runtime == (void *)0x0)) {
    port_local._7_1_ = true;
  }
  else {
    sStackY_120 = 0x10692e;
    rtosc::Port::meta(in_stack_fffffffffffffee8);
    sStackY_120 = 0x106942;
    pcVar4 = rtosc::Port::MetaContainer::operator[]
                       (pMStack_c8,(char *)CONCAT17(old_end._7_1_,old_end._0_7_));
    if (pcVar4 == (char *)0x0) {
      port_local._7_1_ = true;
    }
    else {
      e = port->name;
      pcStack_60 = pcVar4;
      while( true ) {
        uVar12 = false;
        if (((*e != '\0') && (uVar12 = false, *e == *pcStack_60)) && (uVar12 = false, *e != '/')) {
          uVar12 = *pcStack_60 != '/';
        }
        if ((bool)uVar12 == false) break;
        e = e + 1;
        pcStack_60 = pcStack_60 + 1;
      }
      bVar10 = false;
      if (*pcStack_60 == '/') {
        bVar10 = *e == '/';
      }
      local_f0 = base;
      local_e8 = pcVar4;
      uVar11 = bVar10;
      if (bVar10 != false) {
        local_e8 = pcStack_60 + 1;
        sStackY_120 = 0x106a53;
        pPVar5 = rtosc::Ports::operator[]
                           (in_stack_ffffffffffffff28,
                            (char *)(ulong)CONCAT16(bVar10,in_stack_ffffffffffffff20));
        local_f0 = pPVar5->ports;
      }
      sStackY_120 = 0x106a83;
      rval.val.b.data =
           (uint8_t *)
           rtosc::Ports::operator[]
                     (in_stack_ffffffffffffff28,
                      (char *)CONCAT17(uVar12,CONCAT16(uVar11,in_stack_ffffffffffffff20)));
      sStackY_120 = 0x106a90;
      sVar6 = strlen(loc);
      iVar3 = (int)sVar6;
      lVar1 = -(loc_size + 0xf & 0xfffffffffffffff0);
      pcVar9 = &stack0xfffffffffffffee8 + lVar1;
      local_f8 = pcVar9;
      *(undefined8 *)((long)&sStackY_120 + lVar1) = 0x106acf;
      strcpy(pcVar9,loc);
      pcVar7 = local_f8;
      if (relative_to_parent) {
        *(undefined8 *)((long)&sStackY_120 + lVar1) = 0x106afa;
        strncat(pcVar7,"../",(loc_size - (long)iVar3) - 1);
      }
      pcVar7 = local_f8;
      *(undefined8 *)((long)&sStackY_120 + lVar1) = 0x106b1c;
      strncat(pcVar7,pcVar4,(loc_size - (long)iVar3) - 4);
      *(undefined8 *)((long)&sStackY_120 + lVar1) = 0x106b28;
      pcVar4 = rtosc::Ports::collapsePath(*(char **)((long)&local_f0 + lVar1));
      pcVar7 = local_f8 + (loc_size - (long)pcVar4);
      pcVar9 = pcVar9 + -((ulong)(pcVar7 + 0xf) & 0xfffffffffffffff0);
      local_100 = pcVar9;
      pcVar9[-8] = -0x7e;
      pcVar9[-7] = 'k';
      pcVar9[-6] = '\x10';
      pcVar9[-5] = '\0';
      pcVar9[-4] = '\0';
      pcVar9[-3] = '\0';
      pcVar9[-2] = '\0';
      pcVar9[-1] = '\0';
      pcVar8 = strrchr(pcVar4,0x2f);
      if (pcVar8 == (char *)0x0) {
        local_108 = pcVar4;
      }
      else {
        local_108 = pcVar8 + 1;
      }
      pcVar9[-8] = -0x34;
      pcVar9[-7] = 'k';
      pcVar9[-6] = '\x10';
      pcVar9[-5] = '\0';
      pcVar9[-4] = '\0';
      pcVar9[-3] = '\0';
      pcVar9[-2] = '\0';
      pcVar9[-1] = '\0';
      fast_strcpy(*(char **)(pcVar9 + 8),*(char **)pcVar9,*(size_t *)(pcVar9 + -8));
      uVar2 = rval.val.b.data;
      pcVar8 = local_100;
      pcVar9[-0x20] = '\x01';
      pcVar9[-0x1f] = '\0';
      pcVar9[-0x1e] = '\0';
      pcVar9[-0x1d] = '\0';
      pcVar9[-0x1c] = '\0';
      pcVar9[-0x1b] = '\0';
      pcVar9[-0x1a] = '\0';
      pcVar9[-0x19] = '\0';
      *(char **)(pcVar9 + -0x18) = local_98;
      pcVar9[-0x10] = '\0';
      pcVar9[-0xf] = '\0';
      pcVar9[-0xe] = '\0';
      pcVar9[-0xd] = '\0';
      pcVar9[-0xc] = '\0';
      pcVar9[-0xb] = '\0';
      pcVar9[-10] = '\0';
      pcVar9[-9] = '\0';
      pcVar9[-0x28] = '\x15';
      pcVar9[-0x27] = 'l';
      pcVar9[-0x26] = '\x10';
      pcVar9[-0x25] = '\0';
      pcVar9[-0x24] = '\0';
      pcVar9[-0x23] = '\0';
      pcVar9[-0x22] = '\0';
      pcVar9[-0x21] = '\0';
      rtosc::helpers::get_value_from_runtime
                (runtime,(Port *)uVar2,(size_t)pcVar7,pcVar4,pcVar8,0x2000,
                 *(size_t *)(pcVar9 + -0x20),*(rtosc_arg_val_t **)(pcVar9 + -0x18),
                 *(vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                   **)(pcVar9 + -0x10));
      uVar2 = rval.val.b.data;
      local_109 = true;
      if (local_98[0] != 'T') {
        local_10a = local_98[0] == 'i' && rval._0_4_ != 0;
        local_109 = local_10a;
      }
      port_local._7_1_ = local_109;
      if (((walker != (port_walker_t)0x0) && (local_109 == false)) &&
         ((bVar10 != false || (!relative_to_parent)))) {
        pcVar7 = local_f8 + (long)iVar3 + 3;
        pcVar9[-8] = -0x39;
        pcVar9[-7] = 'l';
        pcVar9[-6] = '\x10';
        pcVar9[-5] = '\0';
        pcVar9[-4] = '\0';
        pcVar9[-3] = '\0';
        pcVar9[-2] = '\0';
        pcVar9[-1] = '\0';
        (*walker)((Port *)uVar2,pcVar4,pcVar7,base,data,runtime);
      }
    }
  }
  return port_local._7_1_;
}

Assistant:

bool port_is_enabled(const Port* port, char* loc, size_t loc_size,
                     const Ports& base, void *runtime,
                     bool relative_to_parent,
                     port_walker_t walker, void* data)
{
    // TODO: this code should be improved
    if(port && runtime)
    {
        const char* enable_port = port->meta()["enabled by"];
        if(enable_port)
        {
            /*
                find out which Ports object to dispatch at
                (the current one or its child?)
             */
            const char* n = port->name;
            const char* e = enable_port;
            for( ; *n && (*n == *e) && *n != '/' && *e != '/'; ++n, ++e) ;

            bool subport = (*e == '/' && *n == '/');

            const char* ask_port_str = subport
                                       ? e+1
                                       : enable_port;

            const Ports& ask_ports = subport ? *base[port->name]->ports
                                             : base;

            assert(!strchr(ask_port_str, '/'));
            const Port* ask_port = ask_ports[ask_port_str];
            assert(ask_port);

            rtosc_arg_val_t rval;

            /*
                concatenate the location string
             */
            int loclen = strlen(loc);
            STACKALLOC(char, loc_copy, loc_size);
            strcpy(loc_copy, loc); // TODO: clang says strcpy is insecure
            if(relative_to_parent)
                strncat(loc_copy, "../", loc_size - loclen - 1);
            strncat(loc_copy, enable_port, loc_size - loclen - 3 - 1);

            char* collapsed_loc = Ports::collapsePath(loc_copy);
            loc_size -= (collapsed_loc - loc_copy);

            /*
                receive the "enabled" property
             */
            STACKALLOC(char, buf, loc_size);
            // TODO: pass a parameter portname_from_base, since Ports might
            //       also be of type a#N/b
            const char* last_slash = strrchr(collapsed_loc, '/');
            fast_strcpy(buf, last_slash ? last_slash + 1 : collapsed_loc,
                        loc_size); // TODO: bug: VoicePar#8/Enabled

            helpers::get_value_from_runtime(runtime,
                *ask_port, loc_size, collapsed_loc, buf,
                8192, 1, &rval, nullptr);
            assert(rval.type == 'T' || rval.type == 'F' || rval.type == 'i');

            bool res = rval.type == 'T' || (rval.type == 'i' && rval.val.i != 0);
            /*
             * If called from walk_ports, an enabling port must always be
             * traversed. However, if such a port resides inside a the port
             * which it currently disables, walk_ports would normally *not*
             * traverse it. So this allows still running walk_ports.
             */
            if (walker && !res && (subport || !relative_to_parent)) {
                // this makes some assumptions on how Ports::collapsePath works:
                // it starts at the end and keeps the string unchanged until the
                // first ".." - so we get:
                //    <loclen><4->
                //    /loc/abc/../enable
                //            abc/enable
                //
                const char* old_end = loc_copy + loclen + 3;
                walker(ask_port, collapsed_loc, old_end, base, data, runtime);
            }

            return res;
        }
        else // Port has no "enabled" property, so it is always enabled
            return true;
    }
    else // no runtime provided, so run statically through all subports
        return true;
}